

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# makefile.cpp
# Opt level: O3

MakefileGenerator * __thiscall MakefileGenerator::fileInfo(MakefileGenerator *this,QString file)

{
  char cVar1;
  QFileInfo *pQVar2;
  QString *in_RDX;
  long in_FS_OFFSET;
  undefined1 *local_70;
  FileInfoCacheKey local_68;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  if (fileInfo(QString)::noInfo == '\0') {
    fileInfo();
  }
  if (fileInfo::cache == (QHash<FileInfoCacheKey,_QFileInfo> *)0x0) {
    fileInfo::cache = (QHash<FileInfoCacheKey,_QFileInfo> *)operator_new(8);
    fileInfo::cache->d = (Data *)0x0;
    qmakeAddCacheClear(qmakeDeleteCacheClear<QHash<FileInfoCacheKey,QFileInfo>>,&fileInfo::cache);
  }
  local_68.pwd.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_68.pwd.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_68.pwd.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  local_68.file.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  local_68.file.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_68.hash = (size_t)&DAT_aaaaaaaaaaaaaaaa;
  local_68.file.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  FileInfoCacheKey::FileInfoCacheKey(&local_68,in_RDX);
  local_70 = &DAT_aaaaaaaaaaaaaaaa;
  pQVar2 = QHash<FileInfoCacheKey,_QFileInfo>::valueImpl<FileInfoCacheKey>
                     (fileInfo::cache,&local_68);
  if (pQVar2 == (QFileInfo *)0x0) {
    pQVar2 = (QFileInfo *)&fileInfo(QString)::noInfo;
  }
  QFileInfo::QFileInfo((QFileInfo *)&local_70,pQVar2);
  cVar1 = comparesEqual((QFileInfo *)&local_70,(QFileInfo *)&fileInfo(QString)::noInfo);
  if (cVar1 == '\0') {
    QFileInfo::QFileInfo((QFileInfo *)this,(QFileInfo *)&local_70);
  }
  else {
    (this->super_QMakeSourceFileInfo)._vptr_QMakeSourceFileInfo =
         (_func_int **)&DAT_aaaaaaaaaaaaaaaa;
    QFileInfo::QFileInfo((QFileInfo *)this,(QString *)in_RDX);
    cVar1 = QFileInfo::exists();
    if (cVar1 != '\0') {
      QHash<FileInfoCacheKey,QFileInfo>::emplace<QFileInfo_const&>
                ((QHash<FileInfoCacheKey,QFileInfo> *)fileInfo::cache,&local_68,(QFileInfo *)this);
    }
  }
  QFileInfo::~QFileInfo((QFileInfo *)&local_70);
  if (&(local_68.pwd.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_68.pwd.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_68.pwd.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_68.pwd.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_68.pwd.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_68.file.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_68.file.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_68.file.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_68.file.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_68.file.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return this;
  }
  __stack_chk_fail();
}

Assistant:

QFileInfo
MakefileGenerator::fileInfo(QString file) const
{
    Q_CONSTINIT static QHash<FileInfoCacheKey, QFileInfo> *cache = nullptr;
    static QFileInfo noInfo = QFileInfo();
    if(!cache) {
        cache = new QHash<FileInfoCacheKey, QFileInfo>;
        qmakeAddCacheClear(qmakeDeleteCacheClear<QHash<FileInfoCacheKey, QFileInfo> >, (void**)&cache);
    }
    FileInfoCacheKey cacheKey(file);
    QFileInfo value = cache->value(cacheKey, noInfo);
    if (value != noInfo)
        return value;

    QFileInfo fi(file);
    if (fi.exists())
        cache->insert(cacheKey, fi);
    return fi;
}